

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_init(raplcap *rc)

{
  int iVar1;
  int *piVar2;
  raplcap_msr_sys_ctx *prVar3;
  uint32_t local_34;
  int err_save;
  uint32_t n_die;
  uint32_t n_pkg;
  uint32_t cpu_model;
  uint64_t msrval;
  raplcap_msr *state;
  raplcap *rc_local;
  
  state = (raplcap_msr *)rc;
  if (rc == (raplcap *)0x0) {
    state = (raplcap_msr *)&rc_default;
  }
  n_die = msr_get_supported_cpu_model();
  if (n_die == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x5f;
    rc_local._4_4_ = -1;
  }
  else {
    msrval = (uint64_t)malloc(0x40);
    if ((void *)msrval == (void *)0x0) {
      rc_local._4_4_ = -1;
    }
    else {
      prVar3 = msr_sys_init((uint32_t *)&err_save,&local_34);
      *(raplcap_msr_sys_ctx **)(msrval + 0x38) = prVar3;
      if (prVar3 == (raplcap_msr_sys_ctx *)0x0) {
        free((void *)msrval);
        rc_local._4_4_ = -1;
      }
      else {
        *(int *)&(state->ctx).cfg = err_save;
        (state->ctx).power_units = (double)msrval;
        iVar1 = msr_sys_read(*(raplcap_msr_sys_ctx **)(msrval + 0x38),(uint64_t *)&n_pkg,0,0,0x606);
        if (iVar1 == 0) {
          msr_get_context((raplcap_msr_ctx *)msrval,n_die,_n_pkg);
          rc_local._4_4_ = 0;
        }
        else {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          raplcap_destroy((raplcap *)state);
          piVar2 = __errno_location();
          *piVar2 = iVar1;
          rc_local._4_4_ = -1;
        }
      }
    }
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_init(raplcap* rc) {
  if (rc == NULL) {
    rc = &rc_default;
  }
  raplcap_msr* state;
  uint64_t msrval;
  uint32_t cpu_model;
  uint32_t n_pkg;
  uint32_t n_die;
  int err_save;
  // check that we recognize the CPU
  if ((cpu_model = msr_get_supported_cpu_model()) == 0) {
    errno = ENOTSUP;
    return -1;
  }
  if ((state = malloc(sizeof(*state))) == NULL) {
    return -1;
  }
  if ((state->sys = msr_sys_init(&n_pkg, &n_die)) == NULL) {
    free(state);
    return -1;
  }
  rc->nsockets = n_pkg;
  rc->state = state;
  if (msr_sys_read(state->sys, &msrval, 0, 0, MSR_RAPL_POWER_UNIT)) {
    err_save = errno;
    raplcap_destroy(rc);
    errno = err_save;
    return -1;
  }
  // now populate context with unit conversions and function pointers
  msr_get_context(&state->ctx, cpu_model, msrval);
  raplcap_log(DEBUG, "raplcap_init: Initialized\n");
  return 0;
}